

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

string * __thiscall
ELFIO::dump::find_value_in_table<ELFIO::type_table_t[5],unsigned_short>
          (string *__return_storage_ptr__,dump *this,type_table_t (*table) [5],unsigned_short *key)

{
  uint local_38;
  uint i;
  allocator<char> local_22;
  undefined1 local_21;
  type_table_t (*local_20) [5];
  unsigned_short *key_local;
  type_table_t (*table_local) [5];
  string *res;
  
  local_21 = 0;
  local_20 = table;
  key_local = (unsigned_short *)this;
  table_local = (type_table_t (*) [5])__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_22)
  ;
  std::allocator<char>::~allocator(&local_22);
  local_38 = 0;
  while( true ) {
    if (4 < local_38) {
      return __return_storage_ptr__;
    }
    if (key_local[(ulong)local_38 * 8] == (*local_20)[0].key) break;
    local_38 = local_38 + 1;
  }
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,*(char **)(key_local + (ulong)local_38 * 8 + 4));
  return __return_storage_ptr__;
}

Assistant:

std::string static find_value_in_table( const T& table, const K& key )
    {
        std::string res = "?";
        for ( unsigned int i = 0; i < sizeof( table ) / sizeof( table[0] );
              ++i ) {
            if ( table[i].key == key ) {
                res = table[i].str;
                break;
            }
        }

        return res;
    }